

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

ValueVectorOf<xercesc_4_0::PrefMapElem_*> * __thiscall
xercesc_4_0::ElemStack::getNamespaceMap(ElemStack *this)

{
  ValueVectorOf<xercesc_4_0::PrefMapElem_*> *pVVar1;
  PrefMapElem *pPVar2;
  XMLSize_t XVar3;
  StackElem *pSVar4;
  XMLSize_t XVar5;
  ulong uVar6;
  long lVar7;
  
  this->fNamespaceMap->fCurCount = 0;
  for (XVar5 = this->fStackTop; XVar5 != 0; XVar5 = XVar5 - 1) {
    pSVar4 = this->fStack[XVar5 - 1];
    if ((pSVar4->fMapCount != 0) && (pSVar4->fMapCount != 0)) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        pVVar1 = this->fNamespaceMap;
        pPVar2 = pSVar4->fMap;
        ValueVectorOf<xercesc_4_0::PrefMapElem_*>::ensureExtraCapacity(pVVar1,1);
        XVar3 = pVVar1->fCurCount;
        pVVar1->fCurCount = XVar3 + 1;
        pVVar1->fElemList[XVar3] = (PrefMapElem *)((long)&pPVar2->fPrefId + lVar7);
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 8;
      } while (uVar6 < pSVar4->fMapCount);
    }
  }
  if ((this->fGlobalNamespaces != (StackElem *)0x0) &&
     (pSVar4 = this->fGlobalNamespaces, pSVar4->fMapCount != 0)) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      pVVar1 = this->fNamespaceMap;
      pPVar2 = pSVar4->fMap;
      ValueVectorOf<xercesc_4_0::PrefMapElem_*>::ensureExtraCapacity(pVVar1,1);
      XVar5 = pVVar1->fCurCount;
      pVVar1->fCurCount = XVar5 + 1;
      pVVar1->fElemList[XVar5] = (PrefMapElem *)((long)&pPVar2->fPrefId + lVar7);
      uVar6 = uVar6 + 1;
      pSVar4 = this->fGlobalNamespaces;
      lVar7 = lVar7 + 8;
    } while (uVar6 < pSVar4->fMapCount);
  }
  return this->fNamespaceMap;
}

Assistant:

ValueVectorOf<PrefMapElem*>* ElemStack::getNamespaceMap() const
{
    fNamespaceMap->removeAllElements();

    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    for (XMLSize_t index = fStackTop; index > 0; index--)
    {
        // Get a convenience pointer to the current element
        StackElem* curRow = fStack[index-1];

        // If no prefixes mapped at this level, then go the next one
        if (!curRow->fMapCount)
            continue;

        // Search the map at this level for the passed prefix
        for (XMLSize_t mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
            fNamespaceMap->addElement(&(curRow->fMap[mapIndex]));
    }
    //  Add the global namespaces
    if(fGlobalNamespaces)
    {
        for (XMLSize_t mapIndex = 0; mapIndex < fGlobalNamespaces->fMapCount; mapIndex++)
            fNamespaceMap->addElement(&(fGlobalNamespaces->fMap[mapIndex]));
    }

    return fNamespaceMap;
}